

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_datetime_digit
          (parser_t<events_aggregator_t> *this)

{
  size_t sVar1;
  char cVar2;
  parser_error_t *this_00;
  size_t offset;
  allocator local_31;
  string local_30;
  
  cVar2 = input_stream_t::get(&this->input);
  if ((int)cVar2 - 0x30U < 10) {
    return cVar2;
  }
  this_00 = (parser_error_t *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_30,"Bad datetime. Expected digit.",&local_31);
  sVar1 = (this->input).m_processed;
  offset = 0;
  if (sVar1 != 0) {
    offset = sVar1 - 1;
  }
  parser_error_t::parser_error_t(this_00,&local_30,offset);
  __cxa_throw(this_00,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

char parse_datetime_digit() {
        char ch = input.get();
        if (std::isdigit(ch)) {
            return ch;
        } else {
            throw parser_error_t("Bad datetime. Expected digit.", last_char_offset());
        }
    }